

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall libcellml::Variable::removeAllEquivalences(Variable *this)

{
  bool bVar1;
  VariableImpl *pVVar2;
  element_type *this_00;
  undefined1 local_60 [8];
  shared_ptr<libcellml::Variable> equivalentVariable;
  weak_ptr<libcellml::Variable> *variable;
  iterator __end1;
  iterator __begin1;
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
  *__range1;
  shared_ptr<libcellml::Variable> thisVariable;
  Variable *this_local;
  
  thisVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::enable_shared_from_this<libcellml::Variable>::shared_from_this
            ((enable_shared_from_this<libcellml::Variable> *)&__range1);
  pVVar2 = pFunc(this);
  __end1 = std::
           vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ::begin(&pVVar2->mEquivalentVariables);
  variable = (weak_ptr<libcellml::Variable> *)
             std::
             vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
             ::end(&pVVar2->mEquivalentVariables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
                                     *)&variable), bVar1) {
    equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
         ::operator*(&__end1);
    std::weak_ptr<libcellml::Variable>::lock((weak_ptr<libcellml::Variable> *)local_60);
    bVar1 = std::operator!=((shared_ptr<libcellml::Variable> *)local_60,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_60);
      pVVar2 = pFunc(this_00);
      VariableImpl::unsetEquivalentTo(pVVar2,(VariablePtr *)&__range1);
    }
    std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_60);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
    ::operator++(&__end1);
  }
  pVVar2 = pFunc(this);
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  clear(&pVVar2->mEquivalentVariables);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)&__range1);
  return;
}

Assistant:

void Variable::removeAllEquivalences()
{
    auto thisVariable = shared_from_this();
    for (const auto &variable : pFunc()->mEquivalentVariables) {
        auto equivalentVariable = variable.lock();
        if (equivalentVariable != nullptr) {
            equivalentVariable->pFunc()->unsetEquivalentTo(thisVariable);
        }
    }
    pFunc()->mEquivalentVariables.clear();
}